

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printing.h
# Opt level: O2

ostream * printText(ostream *o,string_view str,bool needQuotes)

{
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,needQuotes) == 0) {
    Colors::green(o);
    std::__ostream_insert<char,std::char_traits<char>>(o,str._M_str,str._M_len);
    Colors::normal(o);
  }
  else {
    std::operator<<(o,'\"');
    Colors::green(o);
    std::__ostream_insert<char,std::char_traits<char>>(o,str._M_str,str._M_len);
    Colors::normal(o);
    std::operator<<(o,'\"');
  }
  return o;
}

Assistant:

inline std::ostream&
printText(std::ostream& o, std::string_view str, bool needQuotes = true) {
  if (needQuotes) {
    o << '"';
  }
  Colors::green(o);
  o << str;
  Colors::normal(o);
  if (needQuotes) {
    o << '"';
  }
  return o;
}